

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

matrix4d * __thiscall tinyusdz::value::matrix4d::operator=(matrix4d *this,matrix4f *src)

{
  double *pdVar1;
  undefined8 uVar2;
  matrix4d *pmVar3;
  size_t j;
  long lVar4;
  long lVar5;
  
  pmVar3 = this;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar2 = *(undefined8 *)(*(float (*) [4])*(float (*) [4])src + lVar5);
      pdVar1 = *(double (*) [4])*(double (*) [4])this + lVar5;
      *pdVar1 = (double)(float)uVar2;
      pdVar1[1] = (double)(float)((ulong)uVar2 >> 0x20);
      lVar5 = lVar5 + 2;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    src = (matrix4f *)((long)src + 0x10);
    this = (matrix4d *)((long)this + 0x20);
  } while (lVar4 != 4);
  return pmVar3;
}

Assistant:

matrix4d &matrix4d::operator=(const matrix4f &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}